

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

StringRef __thiscall
llvm::StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
          (StringRef *this,BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *A)

{
  StringRef *__result;
  iterator __first;
  iterator __last;
  char *S;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *A_local;
  StringRef *this_local;
  size_t local_30;
  StringRef *local_10;
  
  local_10 = this;
  if (this->Length == 0) {
    memset(&this_local,0,0x10);
    StringRef((StringRef *)&this_local);
  }
  else {
    __result = (StringRef *)
               AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::
               Allocate<char>((AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                               *)A,this->Length);
    __first = begin(this);
    __last = end(this);
    std::copy<char_const*,char*>(__first,__last,(char *)__result);
    this_local = __result;
    local_30 = this->Length;
  }
  return _this_local;
}

Assistant:

LLVM_NODISCARD StringRef copy(Allocator &A) const {
      // Don't request a length 0 copy from the allocator.
      if (empty())
        return StringRef();
      char *S = A.template Allocate<char>(Length);
      std::copy(begin(), end(), S);
      return StringRef(S, Length);
    }